

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Group * __thiscall
kj::Arena::
allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
          (Arena *this,Union *params)

{
  Group *location;
  Union *params_00;
  Group *result;
  Union *params_local;
  Arena *this_local;
  
  location = (Group *)allocateBytes(this,0x38,8,true);
  params_00 = fwd<capnp::compiler::NodeTranslator::StructLayout::Union&>(params);
  ctor<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
            (location,params_00);
  setDestructor(this,location,destroyObject<capnp::compiler::NodeTranslator::StructLayout::Group>);
  return location;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}